

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

void __thiscall QDialogButtonBox::clear(QDialogButtonBox *this)

{
  QAbstractButton *pQVar1;
  bool bVar2;
  QDialogButtonBoxPrivate *signal;
  const_iterator o;
  QAbstractButton **ppQVar3;
  long in_FS_OFFSET;
  QAbstractButton *button;
  add_const_t<QList<QAbstractButton_*>_> *__range2;
  QList<QAbstractButton_*> *list;
  int i;
  QDialogButtonBoxPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  code *in_stack_ffffffffffffff90;
  QList<QAbstractButton_*> *slot;
  int local_34;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  signal = d_func((QDialogButtonBox *)0x66d465);
  QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
  ::clear((QFlatMap<QPushButton_*,_QDialogButtonBox::StandardButton,_std::less<QPushButton_*>,_QVarLengthArray<QPushButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::StandardButton,_8LL>_>
           *)in_stack_ffffffffffffff90);
  for (local_34 = 0; local_34 < 9; local_34 = local_34 + 1) {
    slot = signal->buttonLists + local_34;
    local_10.i = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
    local_10 = QList<QAbstractButton_*>::begin
                         ((QList<QAbstractButton_*> *)in_stack_ffffffffffffff90);
    o = QList<QAbstractButton_*>::end((QList<QAbstractButton_*> *)in_stack_ffffffffffffff90);
    while( true ) {
      bVar2 = QList<QAbstractButton_*>::const_iterator::operator!=(&local_10,o);
      if (!bVar2) break;
      ppQVar3 = QList<QAbstractButton_*>::const_iterator::operator*(&local_10);
      pQVar1 = *ppQVar3;
      in_stack_ffffffffffffff90 = QDialogButtonBoxPrivate::handleButtonDestroyed;
      QObjectPrivate::disconnect<void(QObject::*)(QObject*),void(QDialogButtonBoxPrivate::*)()>
                ((Object *)0x0,(offset_in_QObject_to_subr)signal,
                 (Object *)QDialogButtonBoxPrivate::handleButtonDestroyed,(Function)slot);
      if (pQVar1 != (QAbstractButton *)0x0) {
        (**(code **)(*(long *)&pQVar1->super_QWidget + 0x20))();
      }
      QList<QAbstractButton_*>::const_iterator::operator++(&local_10);
    }
    QList<QAbstractButton_*>::clear((QList<QAbstractButton_*> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialogButtonBox::clear()
{
    Q_D(QDialogButtonBox);
    // Remove the created standard buttons, they should be in the other lists, which will
    // do the deletion
    d->standardButtonMap.clear();
    for (int i = 0; i < NRoles; ++i) {
        QList<QAbstractButton *> &list = d->buttonLists[i];
        for (auto button : std::as_const(list)) {
            QObjectPrivate::disconnect(button, &QAbstractButton::destroyed,
                                       d, &QDialogButtonBoxPrivate::handleButtonDestroyed);
            delete button;
        }
        list.clear();
    }
}